

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

void icetRenderTransferFullImages
               (IceTImage image,IceTVoid *inSparseImageBuffer,IceTSparseImage outSparseImage,
               IceTInt *tile_image_dest)

{
  IceTBoolean messagesInOrder;
  IceTSizeType bufferSize;
  IceTInt *pIVar1;
  IceTInt *messageDestinations;
  long lVar2;
  IceTInt height;
  IceTInt width;
  IceTInt num_tiles;
  IceTInt num_sending;
  IceTSizeType local_40;
  IceTSizeType local_3c;
  int local_38;
  int local_34;
  
  rtfi_first = 1;
  rtfi_image = image;
  rtfi_outSparseImage = outSparseImage;
  icetGetIntegerv(0x86,&local_34);
  pIVar1 = icetUnsafeStateGetInteger(0x87);
  icetGetIntegerv(0x13,&local_3c);
  icetGetIntegerv(0x14,&local_40);
  icetGetIntegerv(0x10,&local_38);
  messageDestinations = (IceTInt *)malloc((long)local_38 << 2);
  if (0 < (long)local_34) {
    lVar2 = 0;
    do {
      messageDestinations[lVar2] = tile_image_dest[pIVar1[lVar2]];
      lVar2 = lVar2 + 1;
    } while (local_34 != lVar2);
  }
  messagesInOrder = icetIsEnabled(0x142);
  bufferSize = icetSparseImageBufferSize(local_3c,local_40);
  icetSendRecvLargeMessages
            (local_34,messageDestinations,messagesInOrder,rtfi_generateDataFunc,rtfi_handleDataFunc,
             inSparseImageBuffer,bufferSize);
  free(messageDestinations);
  return;
}

Assistant:

void icetRenderTransferFullImages(IceTImage image,
                                  IceTVoid *inSparseImageBuffer,
                                  IceTSparseImage outSparseImage,
                                  IceTInt *tile_image_dest)
{
    IceTInt num_sending;
    const IceTInt *tile_list;
    IceTInt num_tiles;
    IceTInt width, height;
    IceTInt *imageDestinations;

    IceTInt i;

    rtfi_image = image;
    rtfi_outSparseImage = outSparseImage;
    rtfi_first = ICET_TRUE;

    icetGetIntegerv(ICET_NUM_CONTAINED_TILES, &num_sending);
    tile_list = icetUnsafeStateGetInteger(ICET_CONTAINED_TILES_LIST);
    icetGetIntegerv(ICET_TILE_MAX_WIDTH, &width);
    icetGetIntegerv(ICET_TILE_MAX_HEIGHT, &height);
    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);

    imageDestinations = malloc(num_tiles * sizeof(IceTInt));

  /* Make each element imageDestinations point to the processor to send the
     corresponding image in tile_list. */
    for (i = 0; i < num_sending; i++) {
        imageDestinations[i] = tile_image_dest[tile_list[i]];
    }

    icetSendRecvLargeMessages(num_sending, imageDestinations,
                              icetIsEnabled(ICET_ORDERED_COMPOSITE),
                              rtfi_generateDataFunc, rtfi_handleDataFunc,
                              inSparseImageBuffer,
                              icetSparseImageBufferSize(width, height));

    free(imageDestinations);
}